

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O1

void __thiscall nvtt::InputOptions::Private::computeTargetExtents(Private *this)

{
  RoundMode RVar1;
  InputImage *pIVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (this->images == (InputImage *)0x0) {
    iVar3 = nvAbort("images != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/InputOptions.cpp"
                    ,0x142,"void nvtt::InputOptions::Private::computeTargetExtents() const");
    if (iVar3 == 1) {
      raise(5);
    }
  }
  uVar4 = this->maxExtent;
  RVar1 = this->roundMode;
  if (RVar1 != RoundMode_None) {
    uVar4 = uVar4 >> 1 | uVar4;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar4 = (uVar4 >> 0x10 | uVar4) + 1 >> 1;
  }
  pIVar2 = this->images;
  uVar10 = pIVar2->width;
  uVar8 = pIVar2->height;
  uVar6 = pIVar2->depth;
  uVar7 = uVar8;
  if (uVar8 < uVar10) {
    uVar7 = uVar10;
  }
  if (uVar7 <= uVar6) {
    uVar7 = uVar6;
  }
  if ((uVar4 != 0) && (uVar4 < uVar7)) {
    uVar9 = uVar10 * uVar4;
    uVar10 = uVar9 / uVar7;
    if (uVar9 < uVar7) {
      uVar10 = 1;
    }
    uVar9 = uVar8 * uVar4;
    uVar8 = uVar9 / uVar7;
    if (uVar9 < uVar7) {
      uVar8 = 1;
    }
    uVar4 = uVar6 * uVar4;
    uVar6 = uVar4 / uVar7;
    if (uVar4 < uVar7) {
      uVar6 = 1;
    }
  }
  if (RVar1 == RoundMode_ToPreviousPowerOfTwo) {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    uVar10 = (uVar10 >> 0x10 | uVar10) + 1 >> 1;
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    uVar8 = (uVar8 >> 0x10 | uVar8) + 1 >> 1;
    uVar6 = uVar6 >> 1 | uVar6;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    uVar6 = (uVar6 >> 0x10 | uVar6) + 1 >> 1;
  }
  else if (RVar1 == RoundMode_ToNearestPowerOfTwo) {
    uVar10 = anon_unknown.dwarf_55feed::nearestPowerOfTwo(uVar10);
    uVar8 = anon_unknown.dwarf_55feed::nearestPowerOfTwo(uVar8);
    uVar6 = anon_unknown.dwarf_55feed::nearestPowerOfTwo(uVar6);
  }
  else if (RVar1 == RoundMode_ToNextPowerOfTwo) {
    uVar4 = uVar10 - 1 >> 1 | uVar10 - 1;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar10 = (uVar4 >> 0x10 | uVar4) + 1;
    uVar4 = uVar8 - 1 >> 1 | uVar8 - 1;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar8 = (uVar4 >> 0x10 | uVar4) + 1;
    uVar4 = uVar6 - 1 >> 1 | uVar6 - 1;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar6 = (uVar4 >> 0x10 | uVar4) + 1;
  }
  this->targetWidth = uVar10;
  this->targetHeight = uVar8;
  this->targetDepth = uVar6;
  uVar5 = anon_unknown.dwarf_55feed::countMipmaps(uVar10,uVar8,uVar6);
  this->targetMipmapCount = uVar5;
  return;
}

Assistant:

void InputOptions::Private::computeTargetExtents() const
{
	nvCheck(images != NULL);
	
	uint maxExtent = this->maxExtent;
	if (roundMode != RoundMode_None)
	{
		// rounded max extent should never be higher than original max extent.
		maxExtent = previousPowerOfTwo(maxExtent);
	}

	uint w = images->width;
	uint h = images->height;
	uint d = images->depth;
	
	nvDebugCheck(w > 0);
	nvDebugCheck(h > 0);
	nvDebugCheck(d > 0);
	
	// Scale extents without changing aspect ratio.
	uint maxwhd = max(max(w, h), d);
	if (maxExtent != 0 && maxwhd > maxExtent)
	{
		w = max((w * maxExtent) / maxwhd, 1U);
		h = max((h * maxExtent) / maxwhd, 1U);
		d = max((d * maxExtent) / maxwhd, 1U);
	}
	
	// Round to power of two.
	if (roundMode == RoundMode_ToNextPowerOfTwo)
	{
		w = nextPowerOfTwo(w);
		h = nextPowerOfTwo(h);
		d = nextPowerOfTwo(d);
	}
	else if (roundMode == RoundMode_ToNearestPowerOfTwo)
	{
		w = nearestPowerOfTwo(w);
		h = nearestPowerOfTwo(h);
		d = nearestPowerOfTwo(d);
	}
	else if (roundMode == RoundMode_ToPreviousPowerOfTwo)
	{
		w = previousPowerOfTwo(w);
		h = previousPowerOfTwo(h);
		d = previousPowerOfTwo(d);
	}
	
	this->targetWidth = w;
	this->targetHeight = h;
	this->targetDepth = d;
	
	this->targetMipmapCount = countMipmaps(w, h, d);
}